

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandCut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  Abc_Ntk_t *pNtk;
  int iVar2;
  Cut_Man_t *pMan;
  Cut_Oracle_t *p;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  Cut_Params_t Params;
  Cut_Params_t local_88;
  Abc_Ntk_t *local_38;
  
  local_38 = Abc_FrameReadNtk(pAbc);
  local_88.nIdsMax = 0;
  local_88.nBitShift = 0;
  local_88.nCutSet = 0;
  local_88.fSeq = 0;
  local_88.fMap = 0;
  local_88.fAdjust = 0;
  local_88.fNpnSave = 0;
  local_88.fVerbose = 0;
  local_88.nVarsMax = 5;
  local_88.nKeepMax = 1000;
  local_88.fTruth = 1;
  local_88.fFilter = 1;
  local_88.fDrop = 0;
  local_88.fDag = 1;
  local_88.fTree = 0;
  local_88.fGlobal = 0;
  local_88.fLocal = 0;
  local_88.fRecord = 0;
  local_88.fRecordAig = 1;
  local_88.fFancy = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"KMtfdxyglzamjvosh");
      pNtk = local_38;
      iVar5 = globalUtilOptind;
      if (iVar2 < 0x61) break;
      switch(iVar2) {
      case 0x61:
        local_88._56_8_ = local_88._56_8_ ^ 1;
        break;
      default:
        goto switchD_0025a95e_caseD_62;
      case 100:
        local_88._32_8_ = local_88._32_8_ ^ 1;
        break;
      case 0x66:
        local_88.fFilter = local_88.fFilter ^ 1;
        break;
      case 0x67:
        local_88._40_8_ = local_88._40_8_ ^ 0x100000000;
        break;
      case 0x6a:
        local_88._64_8_ = local_88._64_8_ ^ 0x100000000;
        break;
      case 0x6c:
        local_88._48_8_ = local_88._48_8_ ^ 1;
        break;
      case 0x6d:
        local_88._64_8_ = local_88._64_8_ ^ 1;
        break;
      case 0x6f:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      case 0x73:
        local_88._72_8_ = local_88._72_8_ ^ 1;
        break;
      case 0x74:
        local_88.fTruth = local_88.fTruth ^ 1;
        break;
      case 0x76:
        local_88._72_8_ = local_88._72_8_ ^ 0x100000000;
        break;
      case 0x78:
        local_88._32_8_ = local_88._32_8_ ^ 0x100000000;
        break;
      case 0x79:
        local_88._40_8_ = local_88._40_8_ ^ 1;
        break;
      case 0x7a:
        local_88._56_8_ = local_88._56_8_ ^ 0x100000000;
      }
    }
    if (iVar2 == 0x4b) {
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-K\" should be followed by an integer.\n";
LAB_0025aa90:
        Abc_Print(-1,pcVar3);
        break;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      local_88.nVarsMax = iVar2;
    }
    else {
      if (iVar2 != 0x4d) {
        if (iVar2 == -1) {
          if (local_38 == (Abc_Ntk_t *)0x0) {
            pcVar3 = "Empty network.\n";
          }
          else if (local_38->ntkType == ABC_NTK_STRASH) {
            if (local_88.nVarsMax - 0xdU < 0xfffffff6) {
              Abc_Print(-1,"Can only compute the cuts for %d <= K <= %d.\n",3,0xc);
              return 1;
            }
            if ((local_88.fDag == 0) || (local_88.fTree == 0)) {
              if (local_88.fNpnSave != 0) {
                local_88.nVarsMax = 6;
                local_88.fTruth = 1;
              }
              if (bVar1) {
                local_88.fRecord = 1;
              }
              pMan = Abc_NtkCuts(local_38,&local_88);
              if (bVar1) {
                p = Cut_OracleStart(pMan);
              }
              else {
                p = (Cut_Oracle_t *)0x0;
              }
              Cut_ManStop(pMan);
              if (bVar1) {
                if (p == (Cut_Oracle_t *)0x0) {
                  __assert_fail("pCutOracle",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                                ,0x3156,"int Abc_CommandCut(Abc_Frame_t *, int, char **)");
                }
                Abc_NtkCutsOracle(pNtk,p);
                Cut_OracleStop(p);
                return 0;
              }
              return 0;
            }
            pcVar3 = "Cannot compute both DAG cuts and tree cuts at the same time.\n";
          }
          else {
            pcVar3 = "Cut computation is available only for AIGs (run \"strash\").\n";
          }
          iVar5 = -1;
          goto LAB_0025aca8;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-M\" should be followed by an integer.\n";
        goto LAB_0025aa90;
      }
      iVar2 = atoi(argv[globalUtilOptind]);
      local_88.nKeepMax = iVar2;
    }
    globalUtilOptind = iVar5 + 1;
  } while (-1 < iVar2);
switchD_0025a95e_caseD_62:
  Abc_Print(-2,"usage: cut [-K num] [-M num] [-tfdcovamjsvh]\n");
  Abc_Print(-2,"\t         computes k-feasible cuts for the AIG\n");
  Abc_Print(-2,"\t-K num : max number of leaves (%d <= num <= %d) [default = %d]\n",3,0xc,
            local_88._0_8_ & 0xffffffff);
  Abc_Print(-2,"\t-M num : max number of cuts stored at a node [default = %d]\n",
            (ulong)local_88._0_8_ >> 0x20);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (local_88.fTruth == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-t     : toggle truth table computation [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fFilter == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-f     : toggle filtering of duplicated/dominated [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fDrop == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle dropping when fanouts are done [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fDag == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-x     : toggle computing only DAG cuts [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fTree == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-y     : toggle computing only tree cuts [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fGlobal == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-g     : toggle computing only global cuts [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fLocal == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-l     : toggle computing only local cuts [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fFancy == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-z     : toggle fancy computations [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fRecordAig == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle recording cut functions [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fMap == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-m     : toggle delay-oriented FPGA mapping [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fAdjust == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-j     : toggle removing fanouts due to XOR/MUX [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_88.fNpnSave == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle creating library of 6-var functions [default = %s]\n",pcVar3);
  if (local_88.fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  pcVar3 = "\t-h     : print the command usage\n";
  iVar5 = -2;
LAB_0025aca8:
  Abc_Print(iVar5,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandCut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cut_Params_t Params, * pParams = &Params;
    Cut_Man_t * pCutMan;
    Cut_Oracle_t * pCutOracle = NULL;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fOracle;
    extern Cut_Man_t * Abc_NtkCuts( Abc_Ntk_t * pNtk, Cut_Params_t * pParams );
    extern void Abc_NtkCutsOracle( Abc_Ntk_t * pNtk, Cut_Oracle_t * pCutOracle );

    // set defaults
    fOracle = 0;
    memset( pParams, 0, sizeof(Cut_Params_t) );
    pParams->nVarsMax    = 5;     // the max cut size ("k" of the k-feasible cuts)
    pParams->nKeepMax    = 1000;  // the max number of cuts kept at a node
    pParams->fTruth      = 1;     // compute truth tables
    pParams->fFilter     = 1;     // filter dominated cuts
    pParams->fDrop       = 0;     // drop cuts on the fly
    pParams->fDag        = 1;     // compute DAG cuts
    pParams->fTree       = 0;     // compute tree cuts
    pParams->fGlobal     = 0;     // compute global cuts
    pParams->fLocal      = 0;     // compute local cuts
    pParams->fFancy      = 0;     // compute something fancy
    pParams->fRecordAig  = 1;     // compute something fancy
    pParams->fMap        = 0;     // compute mapping delay
    pParams->fAdjust     = 0;     // removes useless fanouts
    pParams->fNpnSave    = 0;     // enables dumping truth tables
    pParams->fVerbose    = 0;     // the verbosiness flag
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KMtfdxyglzamjvosh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nVarsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nVarsMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nKeepMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nKeepMax < 0 )
                goto usage;
            break;
        case 't':
            pParams->fTruth ^= 1;
            break;
        case 'f':
            pParams->fFilter ^= 1;
            break;
        case 'd':
            pParams->fDrop ^= 1;
            break;
        case 'x':
            pParams->fDag ^= 1;
            break;
        case 'y':
            pParams->fTree ^= 1;
            break;
        case 'g':
            pParams->fGlobal ^= 1;
            break;
        case 'l':
            pParams->fLocal ^= 1;
            break;
        case 'z':
            pParams->fFancy ^= 1;
            break;
        case 'a':
            pParams->fRecordAig ^= 1;
            break;
        case 'm':
            pParams->fMap ^= 1;
            break;
        case 'j':
            pParams->fAdjust ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'o':
            fOracle ^= 1;
            break;
        case 's':
            pParams->fNpnSave ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cut computation is available only for AIGs (run \"strash\").\n" );
        return 1;
    }
    if ( pParams->nVarsMax < CUT_SIZE_MIN || pParams->nVarsMax > CUT_SIZE_MAX )
    {
        Abc_Print( -1, "Can only compute the cuts for %d <= K <= %d.\n", CUT_SIZE_MIN, CUT_SIZE_MAX );
        return 1;
    }
    if ( pParams->fDag && pParams->fTree )
    {
        Abc_Print( -1, "Cannot compute both DAG cuts and tree cuts at the same time.\n" );
        return 1;
    }

    if ( pParams->fNpnSave )
    {
        pParams->nVarsMax = 6;
        pParams->fTruth = 1;
    }

    if ( fOracle )
        pParams->fRecord = 1;
    pCutMan = Abc_NtkCuts( pNtk, pParams );
    if ( fOracle )
        pCutOracle = Cut_OracleStart( pCutMan );
    Cut_ManStop( pCutMan );
    if ( fOracle )
    {
        assert(pCutOracle);
        Abc_NtkCutsOracle( pNtk, pCutOracle );
        Cut_OracleStop( pCutOracle );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: cut [-K num] [-M num] [-tfdcovamjsvh]\n" );
    Abc_Print( -2, "\t         computes k-feasible cuts for the AIG\n" );
    Abc_Print( -2, "\t-K num : max number of leaves (%d <= num <= %d) [default = %d]\n",     CUT_SIZE_MIN, CUT_SIZE_MAX, pParams->nVarsMax );
    Abc_Print( -2, "\t-M num : max number of cuts stored at a node [default = %d]\n",        pParams->nKeepMax );
    Abc_Print( -2, "\t-t     : toggle truth table computation [default = %s]\n",             pParams->fTruth?   "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle filtering of duplicated/dominated [default = %s]\n",   pParams->fFilter?  "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dropping when fanouts are done [default = %s]\n",      pParams->fDrop?    "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle computing only DAG cuts [default = %s]\n",             pParams->fDag?     "yes": "no" );
    Abc_Print( -2, "\t-y     : toggle computing only tree cuts [default = %s]\n",            pParams->fTree?    "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle computing only global cuts [default = %s]\n",          pParams->fGlobal?  "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle computing only local cuts [default = %s]\n",           pParams->fLocal?   "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle fancy computations [default = %s]\n",                  pParams->fFancy?   "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle recording cut functions [default = %s]\n",             pParams->fRecordAig?"yes": "no" );
    Abc_Print( -2, "\t-m     : toggle delay-oriented FPGA mapping [default = %s]\n",         pParams->fMap?     "yes": "no" );
    Abc_Print( -2, "\t-j     : toggle removing fanouts due to XOR/MUX [default = %s]\n",     pParams->fAdjust?  "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating library of 6-var functions [default = %s]\n", pParams->fNpnSave?  "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",        pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}